

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_playground.cpp
# Opt level: O0

int main1(void)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  MyClass *pMVar4;
  ostream *poVar5;
  undefined1 local_28 [8];
  shared_ptr_t<MyClass> mc2;
  shared_ptr_t<MyClass> mc1;
  
  std::operator<<((ostream *)&std::cerr,"--- shared_ptr playground 1 ---\n");
  estl::shared_ptr<MyClass>::shared_ptr((shared_ptr<MyClass> *)&mc2.control_block_ptr_);
  pMVar4 = (MyClass *)operator_new(4);
  MyClass::MyClass(pMVar4);
  estl::shared_ptr<MyClass>::shared_ptr((shared_ptr<MyClass> *)local_28,pMVar4);
  pMVar4 = estl::shared_ptr<MyClass>::operator->((shared_ptr<MyClass> *)local_28);
  MyClass::val(pMVar4,0xc);
  estl::shared_ptr<MyClass>::operator=
            ((shared_ptr<MyClass> *)&mc2.control_block_ptr_,(shared_ptr<MyClass> *)local_28);
  poVar5 = std::operator<<((ostream *)&std::cerr,"mc1.get() : ");
  pMVar4 = estl::shared_ptr<MyClass>::get((shared_ptr<MyClass> *)&mc2.control_block_ptr_);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pMVar4);
  poVar5 = std::operator<<(poVar5,"mc1.use_count():");
  uVar2 = estl::shared_ptr<MyClass>::use_count((shared_ptr<MyClass> *)&mc2.control_block_ptr_);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
  std::operator<<(poVar5," \n");
  estl::shared_ptr<MyClass>::~shared_ptr((shared_ptr<MyClass> *)local_28);
  std::operator<<((ostream *)&std::cerr,"--- shared_ptr playground 2 ---\n");
  poVar5 = std::operator<<((ostream *)&std::cerr,"mc1.get() : ");
  pMVar4 = estl::shared_ptr<MyClass>::get((shared_ptr<MyClass> *)&mc2.control_block_ptr_);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pMVar4);
  poVar5 = std::operator<<(poVar5,"mc1.use_count():");
  uVar2 = estl::shared_ptr<MyClass>::use_count((shared_ptr<MyClass> *)&mc2.control_block_ptr_);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
  std::operator<<(poVar5," \n");
  bVar1 = estl::shared_ptr::operator_cast_to_bool((shared_ptr *)&mc2.control_block_ptr_);
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"mc1->val(): ");
    pMVar4 = estl::shared_ptr<MyClass>::operator->((shared_ptr<MyClass> *)&mc2.control_block_ptr_);
    iVar3 = MyClass::val(pMVar4);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    std::operator<<(poVar5,"\n");
  }
  std::operator<<((ostream *)&std::cerr,"--- shared_ptr playground 3: mc1 ---\n");
  estl::shared_ptr<MyClass>::~shared_ptr((shared_ptr<MyClass> *)&mc2.control_block_ptr_);
  return 0;
}

Assistant:

int main1()
{
    cerr << "--- shared_ptr playground 1 ---\n";
    shared_ptr_t<MyClass> mc1;
    {
        shared_ptr_t<MyClass> mc2 = shared_ptr_t<MyClass>(new MyClass());
        mc2->val(12);
        mc1 = mc2;
        cerr << "mc1.get() : " << mc1.get() << "mc1.use_count():" << mc1.use_count() << " \n";
    }
    cerr << "--- shared_ptr playground 2 ---\n";

    cerr << "mc1.get() : " << mc1.get() << "mc1.use_count():" << mc1.use_count() << " \n";

    if (mc1) {
        cerr << "mc1->val(): " << mc1->val() << "\n";
    }

    cerr << "--- shared_ptr playground 3: mc1 ---\n";

    return 0;
}